

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

EVevent_list copy_EVevent_list(EVevent_list list)

{
  size_t size;
  int iVar1;
  EVevent_list pbVar2;
  void *__dest;
  long lVar3;
  int iVar4;
  
  iVar1 = count_EVevent_list(list);
  pbVar2 = (EVevent_list)INT_CMmalloc((long)iVar1 << 4);
  iVar4 = 1;
  if (1 < iVar1) {
    iVar4 = iVar1;
  }
  for (lVar3 = 0; (ulong)(iVar4 - 1) * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
    size = *(size_t *)((long)&list->length + lVar3);
    *(size_t *)((long)&pbVar2->length + lVar3) = size;
    __dest = INT_CMmalloc(size);
    *(void **)((long)&pbVar2->buffer + lVar3) = __dest;
    memcpy(__dest,*(void **)((long)&list->buffer + lVar3),*(size_t *)((long)&list->length + lVar3));
  }
  pbVar2[iVar4 - 1].length = 0;
  pbVar2[iVar4 - 1].buffer = (void *)0x0;
  return pbVar2;
}

Assistant:

EVevent_list
copy_EVevent_list(EVevent_list list)
{
    EVevent_list ret;
    int i, size = count_EVevent_list(list);
    ret = (EVevent_list) malloc(sizeof(ret[0]) * size);
    for (i=0; i < size-1; i++) {
        ret[i].length = list[i].length;
        ret[i].buffer = malloc(list[i].length);
        memcpy(ret[i].buffer, list[i].buffer, list[i].length);
    }
    ret[i].length = 0;
    ret[i].buffer = NULL;
    return ret;
}